

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray_p.cpp
# Opt level: O2

size_t __thiscall
BamTools::Internal::ByteArray::IndexOf(ByteArray *this,char c,size_t from,size_t to)

{
  const_reference pvVar1;
  size_t i;
  ulong uVar2;
  
  uVar2 = (long)(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (to != 0) {
    uVar2 = to;
  }
  while( true ) {
    if (uVar2 <= from) {
      return (long)(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    }
    pvVar1 = std::vector<char,_std::allocator<char>_>::at(&this->m_data,from);
    if (*pvVar1 == c) break;
    from = from + 1;
  }
  return from;
}

Assistant:

std::size_t ByteArray::IndexOf(const char c, const std::size_t from, const std::size_t to) const
{
    const std::size_t size = ((to == 0) ? m_data.size() : to);
    for (std::size_t i = from; i < size; ++i) {
        if (m_data.at(i) == c) {
            return i;
        }
    }
    return m_data.size();
}